

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

bool __thiscall QSizeGrip::eventFilter(QSizeGrip *this,QObject *o,QEvent *e)

{
  QWidgetPrivate *this_00;
  bool bVar1;
  undefined1 uVar2;
  WindowStates WVar3;
  QObject *pQVar4;
  
  this_00 = *(QWidgetPrivate **)&(this->super_QWidget).field_0x8;
  bVar1 = QWidgetPrivate::isExplicitlyHidden(this_00);
  if (((!bVar1) && (*(short *)(e + 8) == 0x69)) && (*(long *)&this_00[1].field_0x28 != 0)) {
    if (*(int *)(*(long *)&this_00[1].field_0x28 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = *(QObject **)&this_00[1].field_0x30;
    }
    if (pQVar4 == o) {
      WVar3 = QWidget::windowState(*(QWidget **)&this_00[1].field_0x30);
      (**(code **)(*(long *)&this->super_QWidget + 0x68))
                (this,((uint)WVar3.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                             super_QFlagsStorage<Qt::WindowState>.i & 6) == 0);
      QWidget::setAttribute(&this->super_QWidget,WA_WState_ExplicitShowHide,false);
    }
  }
  uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)o);
  return (bool)uVar2;
}

Assistant:

bool QSizeGrip::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QSizeGrip);
    if (d->isExplicitlyHidden()
        || e->type() != QEvent::WindowStateChange
        || o != d->tlw) {
        return QWidget::eventFilter(o, e);
    }
    Qt::WindowStates sizeGripNotVisibleState = Qt::WindowFullScreen;
    sizeGripNotVisibleState |= Qt::WindowMaximized;
    // Don't show the size grip if the tlw is maximized or in full screen mode.
    setVisible(!(d->tlw->windowState() & sizeGripNotVisibleState));
    setAttribute(Qt::WA_WState_ExplicitShowHide, false);
    return QWidget::eventFilter(o, e);
}